

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_vtlb.c
# Opt level: O2

_Bool unicorn_fill_tlb_riscv32
                (CPUState_conflict *cs,vaddr address,int size,MMUAccessType rw,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  uc_struct_conflict10 *puVar1;
  void *pvVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  list_item *plVar7;
  byte bVar8;
  uc_tlb_entry e;
  
  puVar1 = cs->uc;
  plVar7 = (list_item *)(puVar1->hook + 0x11);
  uVar4 = (ulong)((uint)address & 0xfffff000);
  bVar8 = 0x12;
  if (rw != MMU_INST_FETCH) {
    bVar8 = rw == MMU_DATA_STORE | 0x10;
  }
  bVar5 = false;
  do {
    do {
      do {
        plVar7 = plVar7->next;
        if ((plVar7 == (list_item *)0x0) || (pvVar2 = plVar7->data, pvVar2 == (void *)0x0)) {
          if (bVar5) goto LAB_00a64be1;
          e.paddr = uVar4;
          if (rw == MMU_INST_FETCH) {
            e.perms = UC_PROT_EXEC;
            uVar4 = 4;
            goto LAB_00a64bab;
          }
          if (rw == MMU_DATA_STORE) {
            e.perms = UC_PROT_WRITE;
            uVar4 = 2;
            goto LAB_00a64ba1;
          }
          if (rw == MMU_DATA_LOAD) {
            e.perms = UC_PROT_READ;
            uVar4 = 1;
            goto LAB_00a64b99;
          }
          e.perms = UC_PROT_NONE;
          goto LAB_00a64b84;
        }
      } while (*(char *)((long)pvVar2 + 0x14) != '\0');
    } while ((address < *(ulong *)((long)pvVar2 + 0x18) || *(ulong *)((long)pvVar2 + 0x20) < address
             ) && (*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20)));
    cVar3 = (**(code **)((long)pvVar2 + 0x28))
                      (puVar1,uVar4,bVar8,&e,*(undefined8 *)((long)pvVar2 + 0x30));
    bVar5 = true;
  } while (cVar3 == '\0');
LAB_00a64b84:
  if (rw == MMU_INST_FETCH) {
    uVar4 = (ulong)e.perms;
LAB_00a64bab:
    uVar6 = (uint)uVar4;
    uVar4 = uVar4 >> 2 & 0x3f;
  }
  else if (rw == MMU_DATA_STORE) {
    uVar4 = (ulong)e.perms;
LAB_00a64ba1:
    uVar6 = (uint)uVar4;
    uVar4 = uVar4 >> 1 & 0x7f;
  }
  else {
    if (rw != MMU_DATA_LOAD) goto LAB_00a64be1;
    uVar4 = (ulong)e.perms;
LAB_00a64b99:
    uVar6 = (uint)uVar4;
  }
  if ((uVar4 & 1) != 0) {
    tlb_set_page_riscv32
              (cs,(uint)address & 0xfffff000,(ulong)((uint)e.paddr & 0xfffff000),uVar6 & 7,mmu_idx,
               0x1000);
    return true;
  }
LAB_00a64be1:
  if (probe) {
    return false;
  }
  puVar1 = cs->uc;
  puVar1->invalid_error = 0x15;
  puVar1->invalid_addr = address & 0xffffffff;
  cpu_exit((CPUState *)puVar1->cpu);
  cpu_loop_exit_restore_riscv32(cs,retaddr);
}

Assistant:

bool unicorn_fill_tlb(CPUState *cs, vaddr address, int size,
                      MMUAccessType rw, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    bool handled = false;
    bool ret = false;
    struct uc_struct *uc = cs->uc;
    uc_tlb_entry e;
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;

    HOOK_FOREACH(uc, hook, UC_HOOK_TLB_FILL) {
        if (hook->to_delete) {
            continue;
        }
        if (!HOOK_BOUND_CHECK(hook, address)) {
            continue;
        }
        handled = true;
        if ((ret = ((uc_cb_tlbevent_t)hook->callback)(uc, address & TARGET_PAGE_MASK, rw_to_mem_type(rw), &e, hook->user_data))) {
            break;
        }
    }

    if (handled && !ret) {
        goto tlb_miss;
    }

    if (!handled) {
        e.paddr = address & TARGET_PAGE_MASK;
        switch (rw) {
        case MMU_DATA_LOAD:
            e.perms = UC_PROT_READ;
            break;
        case MMU_DATA_STORE:
            e.perms = UC_PROT_WRITE;
            break;
        case MMU_INST_FETCH:
            e.perms = UC_PROT_EXEC;
            break;
        default:
            e.perms = 0;
            break;
        }
    }

    switch (rw) {
    case MMU_DATA_LOAD:
        ret = e.perms & UC_PROT_READ;
        break;
    case MMU_DATA_STORE:
        ret = e.perms & UC_PROT_WRITE;
        break;
    case MMU_INST_FETCH:
        ret = e.perms & UC_PROT_EXEC;
        break;
    default:
        ret = false;
        break;
    }

    if (ret) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK, e.paddr & TARGET_PAGE_MASK, perms_to_prot(e.perms), mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

tlb_miss:
    if (probe) {
        return false;
    }
    raise_mmu_exception(cs, address, rw, retaddr);
    return false;
}